

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O0

void ImGui_ImplGlfw_UpdateMouseData(void)

{
  ImVec2 IVar1;
  int iVar2;
  ImGui_ImplGlfw_Data *pIVar3;
  ImGuiIO *pIVar4;
  float in_stack_00000008;
  float in_stack_0000000c;
  double mouse_y;
  double mouse_x;
  bool is_app_focused;
  ImGuiIO *io;
  ImGui_ImplGlfw_Data *bd;
  float in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd4;
  GLFWwindow *in_stack_ffffffffffffffd8;
  GLFWwindow *in_stack_ffffffffffffffe0;
  
  pIVar3 = ImGui_ImplGlfw_GetBackendData();
  pIVar4 = ImGui::GetIO();
  iVar2 = glfwGetInputMode(in_stack_ffffffffffffffd8,(int)in_stack_ffffffffffffffd4);
  if (iVar2 == 0x34003) {
    ImGuiIO::AddMousePosEvent((ImGuiIO *)mouse_y,in_stack_0000000c,in_stack_00000008);
  }
  else {
    iVar2 = glfwGetWindowAttrib(in_stack_ffffffffffffffd8,(int)in_stack_ffffffffffffffd4);
    if (iVar2 != 0) {
      if ((pIVar4->WantSetMousePos & 1U) != 0) {
        glfwSetCursorPos(in_stack_ffffffffffffffe0,(double)in_stack_ffffffffffffffd8,
                         (double)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      }
      if ((iVar2 != 0) && (pIVar3->MouseWindow == (GLFWwindow *)0x0)) {
        glfwGetCursorPos(in_stack_ffffffffffffffe0,(double *)in_stack_ffffffffffffffd8,
                         (double *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        ImGuiIO::AddMousePosEvent((ImGuiIO *)mouse_y,in_stack_0000000c,in_stack_00000008);
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd0,(float)(double)in_stack_ffffffffffffffe0,
                       (float)(double)in_stack_ffffffffffffffd8);
        IVar1.y = in_stack_ffffffffffffffd4;
        IVar1.x = in_stack_ffffffffffffffd0;
        pIVar3->LastValidMousePos = IVar1;
      }
    }
  }
  return;
}

Assistant:

static void ImGui_ImplGlfw_UpdateMouseData()
{
    ImGui_ImplGlfw_Data* bd = ImGui_ImplGlfw_GetBackendData();
    ImGuiIO& io = ImGui::GetIO();

    if (glfwGetInputMode(bd->Window, GLFW_CURSOR) == GLFW_CURSOR_DISABLED)
    {
        io.AddMousePosEvent(-FLT_MAX, -FLT_MAX);
        return;
    }

#ifdef __EMSCRIPTEN__
    const bool is_app_focused = true;
#else
    const bool is_app_focused = glfwGetWindowAttrib(bd->Window, GLFW_FOCUSED) != 0;
#endif
    if (is_app_focused)
    {
        // (Optional) Set OS mouse position from Dear ImGui if requested (rarely used, only when ImGuiConfigFlags_NavEnableSetMousePos is enabled by user)
        if (io.WantSetMousePos)
            glfwSetCursorPos(bd->Window, (double)io.MousePos.x, (double)io.MousePos.y);

        // (Optional) Fallback to provide mouse position when focused (ImGui_ImplGlfw_CursorPosCallback already provides this when hovered or captured)
        if (is_app_focused && bd->MouseWindow == nullptr)
        {
            double mouse_x, mouse_y;
            glfwGetCursorPos(bd->Window, &mouse_x, &mouse_y);
            io.AddMousePosEvent((float)mouse_x, (float)mouse_y);
            bd->LastValidMousePos = ImVec2((float)mouse_x, (float)mouse_y);
        }
    }
}